

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O1

void __thiscall cmFileLockPool::ScopePool::~ScopePool(ScopePool *this)

{
  pointer ppcVar1;
  
  std::
  for_each<__gnu_cxx::__normal_iterator<cmFileLock*const*,std::vector<cmFileLock*,std::allocator<cmFileLock*>>>,ContainerAlgorithms::DefaultDeleter<std::vector<cmFileLock*,std::allocator<cmFileLock*>>,false>>
            ((this->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  ppcVar1 = (this->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar1 != (pointer)0x0) {
    operator_delete(ppcVar1,(long)(this->Locks).
                                  super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar1)
    ;
    return;
  }
  return;
}

Assistant:

cmFileLockPool::ScopePool::~ScopePool()
{
  cmDeleteAll(this->Locks);
}